

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O2

void Abc_NtkSetNodeLevelsArrival(Abc_Ntk_t *pNtkOld)

{
  void *pvVar1;
  Mio_Library_t *pMVar2;
  Mio_Gate_t *pMVar3;
  Abc_Obj_t *pNode;
  int i;
  float fVar4;
  float fVar5;
  
  if ((pNtkOld->pManTime != (Abc_ManTime_t *)0x0) &&
     (pvVar1 = Abc_FrameReadLibGen(), pvVar1 != (void *)0x0)) {
    i = 0;
    pMVar2 = (Mio_Library_t *)Abc_FrameReadLibGen();
    pMVar3 = Mio_LibraryReadNand2(pMVar2);
    if (pMVar3 != (Mio_Gate_t *)0x0) {
      pMVar2 = (Mio_Library_t *)Abc_FrameReadLibGen();
      fVar4 = Mio_LibraryReadDelayNand2Max(pMVar2);
      for (; i < pNtkOld->vCis->nSize; i = i + 1) {
        pNode = Abc_NtkCi(pNtkOld,i);
        pvVar1 = (pNode->field_6).pTemp;
        fVar5 = Abc_NodeReadArrivalWorst(pNode);
        *(uint *)((long)pvVar1 + 0x14) =
             *(uint *)((long)pvVar1 + 0x14) & 0xfff | (int)(fVar5 / fVar4) << 0xc;
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkSetNodeLevelsArrival( Abc_Ntk_t * pNtkOld )
{
    Abc_Obj_t * pNodeOld, * pNodeNew;
    float tAndDelay;
    int i;
    if ( pNtkOld->pManTime == NULL )
        return;
    if ( Abc_FrameReadLibGen() == NULL || Mio_LibraryReadNand2((Mio_Library_t *)Abc_FrameReadLibGen()) == NULL )
        return;
    tAndDelay = Mio_LibraryReadDelayNand2Max((Mio_Library_t *)Abc_FrameReadLibGen());
    Abc_NtkForEachCi( pNtkOld, pNodeOld, i )
    {
        pNodeNew = pNodeOld->pCopy;
        pNodeNew->Level = (int)(Abc_NodeReadArrivalWorst(pNodeOld) / tAndDelay);
    }
}